

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver.hpp
# Opt level: O1

void progress_bar(int current_frame_index,int total_frames)

{
  ostream *poVar1;
  string clearln;
  string mvleft;
  long *local_68;
  long local_60;
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38 [2];
  
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"\x1b[1000D","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\x1b[2K","");
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_68,local_60);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,color::yellow_abi_cxx11_,DAT_00159630);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," Processing: ",0xd);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,color::green_abi_cxx11_,DAT_001595f0);
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,((current_frame_index + 1) / total_frames) * 100);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"%",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,color::reset_abi_cxx11_,DAT_00159670);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return;
}

Assistant:

void progress_bar(int current_frame_index, int total_frames)
{
    std::string const mvleft = "\033[1000D";
    std::string const clearln = "\033[2K";
    std::cout << mvleft << clearln;
    std::cout << color::yellow << " Processing: " << color::green << ((current_frame_index + 1) / total_frames) * 100 << "%" << color::reset;
}